

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_buffers.c
# Opt level: O3

int av1_alloc_internal_frame_buffers(InternalFrameBufferList *list)

{
  InternalFrameBuffer *pIVar1;
  
  av1_free_internal_frame_buffers(list);
  list->num_internal_frame_buffers = 0x10;
  pIVar1 = (InternalFrameBuffer *)aom_calloc(0x10,0x18);
  list->int_fb = pIVar1;
  if (pIVar1 == (InternalFrameBuffer *)0x0) {
    list->num_internal_frame_buffers = 0;
  }
  return (uint)(pIVar1 == (InternalFrameBuffer *)0x0);
}

Assistant:

int av1_alloc_internal_frame_buffers(InternalFrameBufferList *list) {
  assert(list != NULL);
  av1_free_internal_frame_buffers(list);

  list->num_internal_frame_buffers =
      AOM_MAXIMUM_REF_BUFFERS + AOM_MAXIMUM_WORK_BUFFERS;
  list->int_fb = (InternalFrameBuffer *)aom_calloc(
      list->num_internal_frame_buffers, sizeof(*list->int_fb));
  if (list->int_fb == NULL) {
    list->num_internal_frame_buffers = 0;
    return 1;
  }
  return 0;
}